

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archivable_dictionary.cpp
# Opt level: O2

bool __thiscall ON_ArchivableDictionary::ContainsKey(ON_ArchivableDictionary *this,wchar_t *key)

{
  const_iterator cVar1;
  wchar_t *local_10;
  
  local_10 = key;
  cVar1 = std::
          _Rb_tree<ON_wString,std::pair<ON_wString_const,std::unique_ptr<DictionaryEntry,std::default_delete<DictionaryEntry>>>,std::_Select1st<std::pair<ON_wString_const,std::unique_ptr<DictionaryEntry,std::default_delete<DictionaryEntry>>>>,std::less<void>,std::allocator<std::pair<ON_wString_const,std::unique_ptr<DictionaryEntry,std::default_delete<DictionaryEntry>>>>>
          ::_M_find_tr<wchar_t_const*,void>
                    ((_Rb_tree<ON_wString,std::pair<ON_wString_const,std::unique_ptr<DictionaryEntry,std::default_delete<DictionaryEntry>>>,std::_Select1st<std::pair<ON_wString_const,std::unique_ptr<DictionaryEntry,std::default_delete<DictionaryEntry>>>>,std::less<void>,std::allocator<std::pair<ON_wString_const,std::unique_ptr<DictionaryEntry,std::default_delete<DictionaryEntry>>>>>
                      *)&this->m_private->m_map,&local_10);
  return (_Rb_tree_header *)cVar1._M_node !=
         &(this->m_private->m_map)._M_t._M_impl.super__Rb_tree_header;
}

Assistant:

bool ON_ArchivableDictionary::ContainsKey(const wchar_t* key) const
{
  return m_private->m_map.find(key) != m_private->m_map.cend();
}